

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O0

char * __thiscall Assimp::CFIReaderImpl::getAttributeValue(CFIReaderImpl *this,int idx)

{
  size_type sVar1;
  const_reference pvVar2;
  element_type *peVar3;
  char *pcVar4;
  int idx_local;
  CFIReaderImpl *this_local;
  
  if ((-1 < idx) &&
     (sVar1 = std::
              vector<Assimp::CFIReaderImpl::Attribute,_std::allocator<Assimp::CFIReaderImpl::Attribute>_>
              ::size(&this->attributes), idx < (int)sVar1)) {
    pvVar2 = std::
             vector<Assimp::CFIReaderImpl::Attribute,_std::allocator<Assimp::CFIReaderImpl::Attribute>_>
             ::operator[](&this->attributes,(long)idx);
    peVar3 = std::
             __shared_ptr_access<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&pvVar2->value);
    (**peVar3->_vptr_FIValue)();
    pcVar4 = (char *)std::__cxx11::string::c_str();
    return pcVar4;
  }
  return (char *)0x0;
}

Assistant:

virtual const char* getAttributeValue(int idx) const /*override*/ {
        if (idx < 0 || idx >= (int)attributes.size()) {
            return nullptr;
        }
        return attributes[idx].value->toString().c_str();
    }